

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::LowerJumpTableMultiBranch(Lowerer *this,MultiBranchInstr *multiBrInstr,RegOpnd *indexOpnd)

{
  Func *func;
  void *pvVar1;
  code *pcVar2;
  bool bVar3;
  BYTE scale;
  RegOpnd *dst;
  LabelInstr *labelInstr;
  LabelOpnd *src;
  RegOpnd *baseOpnd;
  undefined4 *puVar4;
  IndirOpnd *src_00;
  Instr *pIVar5;
  
  func = this->m_func;
  dst = IR::RegOpnd::New(TyUint64,func);
  labelInstr = IR::LabelInstr::New(Label,this->m_func,false);
  labelInstr->field_0x78 = labelInstr->field_0x78 | 8;
  src = IR::LabelOpnd::New(labelInstr,this->m_func);
  baseOpnd = IR::RegOpnd::New(TyUint64,func);
  InsertMove(&baseOpnd->super_Opnd,&src->super_Opnd,(Instr *)multiBrInstr,true);
  pvVar1 = multiBrInstr->m_branchTargets;
  if (*(long *)((long)pvVar1 + 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x27ee,"(branchJumpTable->labelInstr == nullptr)",
                       "Should not be already assigned");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  *(LabelInstr **)((long)pvVar1 + 0x10) = labelInstr;
  scale = LowererMDArch::GetDefaultIndirScale();
  src_00 = IR::IndirOpnd::New(baseOpnd,indexOpnd,scale,TyInt64,this->m_func);
  pIVar5 = InsertMove(&dst->super_Opnd,&src_00->super_Opnd,(Instr *)multiBrInstr,true);
  IR::Instr::SetSrc1((Instr *)multiBrInstr,pIVar5->m_dst);
  (multiBrInstr->super_BranchInstr).super_Instr.m_opcode = JMP;
  return;
}

Assistant:

void
Lowerer::LowerJumpTableMultiBranch(IR::MultiBranchInstr * multiBrInstr, IR::RegOpnd * indexOpnd)
{
    Func * func = this->m_func;
    IR::Opnd * opndDst = IR::RegOpnd::New(TyMachPtr, func);
    //Move the native address of the jump table to a register
    IR::LabelInstr * nativeJumpTableLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    nativeJumpTableLabel->m_isDataLabel = true;
    IR::LabelOpnd * nativeJumpTable = IR::LabelOpnd::New(nativeJumpTableLabel, m_func);
    IR::RegOpnd * nativeJumpTableReg = IR::RegOpnd::New(TyMachPtr, func);
    InsertMove(nativeJumpTableReg, nativeJumpTable, multiBrInstr);

    BranchJumpTableWrapper * branchJumpTable = multiBrInstr->GetBranchJumpTable();
    AssertMsg(branchJumpTable->labelInstr == nullptr, "Should not be already assigned");
    branchJumpTable->labelInstr = nativeJumpTableLabel;

    //Indirect addressing @ target location in the jump table.
    //MOV eax, [nativeJumpTableReg + (offset * indirScale)]
    BYTE indirScale = this->m_lowererMD.GetDefaultIndirScale();
    IR::Opnd * opndSrc = IR::IndirOpnd::New(nativeJumpTableReg, indexOpnd, indirScale, TyMachReg, this->m_func);

    IR::Instr * indirInstr = InsertMove(opndDst, opndSrc, multiBrInstr);

    //MultiBr eax
    multiBrInstr->SetSrc1(indirInstr->GetDst());

    //Jump to the address at the target location in the jump table
    multiBrInstr->m_opcode = LowererMD::MDMultiBranchOpcode;
}